

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

string * __thiscall
anon_unknown.dwarf_ad0985::cmCaseInsensitiveDirectoryListGenerator::GetNextCandidate
          (string *__return_storage_ptr__,cmCaseInsensitiveDirectoryListGenerator *this,
          string *parent)

{
  ulong uVar1;
  char *lhs;
  bool bVar2;
  int iVar3;
  unsigned_long uVar4;
  const_pointer rhs;
  cmAlphaNum local_98;
  cmAlphaNum local_68;
  byte local_31;
  char *local_30;
  char *fname;
  string *local_20;
  string *parent_local;
  cmCaseInsensitiveDirectoryListGenerator *this_local;
  string *candidate;
  
  local_20 = parent;
  parent_local = (string *)this;
  this_local = (cmCaseInsensitiveDirectoryListGenerator *)__return_storage_ptr__;
  if ((this->Loaded & 1U) == 0) {
    this->CurrentIdx = 0;
    this->Loaded = true;
    fname = (char *)cmsys::Directory::Load(&this->DirectoryLister,parent,(string *)0x0);
    bVar2 = cmsys::Status::operator_cast_to_bool((Status *)&fname);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
  }
  do {
    do {
      do {
        uVar1 = this->CurrentIdx;
        uVar4 = cmsys::Directory::GetNumberOfFiles(&this->DirectoryLister);
        if (uVar4 <= uVar1) {
          std::__cxx11::string::string((string *)__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        uVar4 = this->CurrentIdx;
        this->CurrentIdx = uVar4 + 1;
        local_30 = cmsys::Directory::GetFile(&this->DirectoryLister,uVar4);
        bVar2 = isDirentryToIgnore(local_30);
        lhs = local_30;
      } while (bVar2);
      rhs = std::basic_string_view<char,_std::char_traits<char>_>::data(&this->DirName);
      iVar3 = cmsysString_strcasecmp(lhs,rhs);
    } while (iVar3 != 0);
    local_31 = 0;
    cmAlphaNum::cmAlphaNum(&local_68,local_20);
    cmAlphaNum::cmAlphaNum(&local_98,'/');
    cmStrCat<char_const*>(__return_storage_ptr__,&local_68,&local_98,&local_30);
    bVar2 = cmsys::SystemTools::FileIsDirectory(__return_storage_ptr__);
    if (bVar2) {
      local_31 = 1;
    }
    if ((local_31 & 1) == 0) {
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
  } while (!bVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string GetNextCandidate(const std::string& parent)
  {
    if (!this->Loaded) {
      this->CurrentIdx = 0ul;
      this->Loaded = true;
      if (!this->DirectoryLister.Load(parent)) {
        return {};
      }
    }

    while (this->CurrentIdx < this->DirectoryLister.GetNumberOfFiles()) {
      const char* const fname =
        this->DirectoryLister.GetFile(this->CurrentIdx++);
      if (isDirentryToIgnore(fname)) {
        continue;
      }
      if (cmsysString_strcasecmp(fname, this->DirName.data()) == 0) {
        auto candidate = cmStrCat(parent, '/', fname);
        if (cmSystemTools::FileIsDirectory(candidate)) {
          return candidate;
        }
      }
    }
    return {};
  }